

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

Matrix<Finite> getMatrix<Finite>(string *prompt)

{
  bool __rhs;
  ostream *this;
  long lVar1;
  istream *__lhs;
  undefined8 uVar2;
  Finite *extraout_RDX;
  string *in_RSI;
  Matrix<Finite> *in_RDI;
  Matrix<Finite> MVar3;
  istringstream is;
  Finite dummy;
  uint cwidth;
  istringstream is_1;
  uint height;
  uint width;
  string sum;
  string s;
  Matrix<Finite> *m;
  Matrix<Finite> *in_stack_fffffffffffffb68;
  allocator *in_stack_fffffffffffffb70;
  Matrix<Finite> *this_00;
  string *in_stack_fffffffffffffbb8;
  Finite *in_stack_fffffffffffffbc8;
  istream *in_stack_fffffffffffffbd0;
  allocator local_2c1;
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [36];
  int local_25c;
  int local_234;
  istringstream local_230 [388];
  int local_ac;
  int local_a8;
  allocator local_a1;
  string local_a0 [32];
  string local_80 [48];
  string local_50 [32];
  string local_30 [48];
  
  this_00 = in_RDI;
  std::__cxx11::string::string(local_30);
  std::__cxx11::string::string(local_50);
  this = std::operator<<((ostream *)&std::cout,in_RSI);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"",&local_a1);
  safeGetline(in_stack_fffffffffffffbb8);
  std::__cxx11::string::operator=(local_30,local_80);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  local_a8 = 0;
  local_ac = 0;
  do {
    lVar1 = std::__cxx11::string::length();
    if (lVar1 == 0) break;
    std::__cxx11::istringstream::istringstream(local_230);
    std::__cxx11::istringstream::str((string *)local_230);
    local_234 = 0;
    Finite::Finite((Finite *)0x117d39);
    while( true ) {
      __lhs = operator>>(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
      __rhs = std::ios::operator_cast_to_bool((ios *)(__lhs + *(long *)(*(long *)__lhs + -0x18)));
      if (!__rhs) break;
      local_234 = local_234 + 1;
    }
    if (local_234 == 0) {
      local_25c = 3;
    }
    else {
      if ((local_a8 != 0) && (local_a8 != local_234)) {
        uVar2 = __cxa_allocate_exception(0x10);
        matrix_error::runtime_error
                  ((matrix_error *)in_stack_fffffffffffffb70,(char *)in_stack_fffffffffffffb68);
        __cxa_throw(uVar2,&matrix_error::typeinfo,matrix_error::~matrix_error);
      }
      local_a8 = local_234;
      local_ac = local_ac + 1;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                     __rhs);
      std::__cxx11::string::operator+=(local_50,local_280);
      std::__cxx11::string::~string(local_280);
      in_stack_fffffffffffffb70 = &local_2c1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2c0,"",in_stack_fffffffffffffb70);
      _readline((string *)in_RSI);
      std::__cxx11::string::operator=(local_30,local_2a0);
      std::__cxx11::string::~string(local_2a0);
      std::__cxx11::string::~string(local_2c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
      local_25c = 0;
    }
    Finite::~Finite((Finite *)0x117fb0);
    std::__cxx11::istringstream::~istringstream(local_230);
  } while (local_25c == 0);
  Matrix<Finite>::Matrix(this_00,(uint)((ulong)in_RDI >> 0x20),(uint)in_RDI);
  std::__cxx11::istringstream::istringstream((istringstream *)&stack0xfffffffffffffbb8);
  std::__cxx11::istringstream::str((string *)&stack0xfffffffffffffbb8);
  operator>>((istream *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
  local_25c = 1;
  std::__cxx11::istringstream::~istringstream((istringstream *)&stack0xfffffffffffffbb8);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  MVar3.arr = extraout_RDX;
  MVar3._0_8_ = this_00;
  return MVar3;
}

Assistant:

Matrix<Field> getMatrix(string prompt)
{
    string s, sum;
    cout << prompt << endl;
    s = safeGetline();
    unsigned width = 0, height = 0;
    while(s.length())
    {
        istringstream is;
        is.str(s);
        unsigned cwidth = 0;
        Field dummy;
        while(is >> dummy)
            ++cwidth;
        if(!cwidth)
            break;
        if(width && width != cwidth)
            throw matrix_error("Incorrect matrix");
        width = cwidth;
        ++height;
        sum += s + ' ';
        s = _readline();
    }
    Matrix<Field> m(height, width);
    istringstream is;
    is.str(sum);
    is >> m;
    return m;
}